

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void __thiscall
duckdb::RLEScanState<duckdb::uhugeint_t>::~RLEScanState(RLEScanState<duckdb::uhugeint_t> *this)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)&PTR__RLEScanState_02468138;
  _Var1._M_head_impl =
       (this->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  (this->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  BufferHandle::~BufferHandle(&this->handle);
  operator_delete(this);
  return;
}

Assistant:

explicit RLEScanState(ColumnSegment &segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		entry_pos = 0;
		position_in_entry = 0;
		rle_count_offset = UnsafeNumericCast<uint32_t>(Load<uint64_t>(handle.Ptr() + segment.GetBlockOffset()));
		D_ASSERT(rle_count_offset <= segment.GetBlockManager().GetBlockSize());
	}